

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bf.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  ulong uVar1;
  byte bVar2;
  pointer __nptr;
  uint uVar3;
  int iVar4;
  int *piVar5;
  long lVar6;
  void *pvVar7;
  ostream *poVar8;
  undefined8 uVar9;
  ulong uVar10;
  int iVar11;
  char cVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  value_type_conflict1 *__val;
  ulong uVar16;
  bool bVar17;
  bool bVar18;
  char c;
  vector<char,_std::allocator<char>_> code;
  vector<unsigned_int,_std::allocator<unsigned_int>_> matching;
  char local_b1;
  int local_b0;
  uint local_ac;
  void *local_a8;
  int local_9c;
  vector<char,_std::allocator<char>_> local_98;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_70;
  timespec local_58;
  ulong local_48;
  long local_40;
  ulong local_38;
  
  local_ac = 0;
  std::ios_base::sync_with_stdio(false);
  if (argc < 2) {
LAB_00102423:
    local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (char *)0x0;
    local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = (char *)0x0;
    local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (char *)0x0;
    std::vector<char,_std::allocator<char>_>::reserve(&local_98,0x400);
    while( true ) {
      while( true ) {
        uVar3 = getchar();
        local_70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start._0_1_ = SUB41(uVar3,0);
        if (local_70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start._0_1_ != (allocator)0x7e) break;
        if (local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
            ._M_finish !=
            local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
            ._M_start) {
          local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_finish = local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_finish + -1;
        }
      }
      if ((uVar3 & 0xff) == 0xff) break;
      if (local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<char,std::allocator<char>>::_M_realloc_insert<char_const&>
                  ((vector<char,std::allocator<char>> *)&local_98,
                   (iterator)
                   local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_finish,(char *)&local_70);
      }
      else {
        *local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
         _M_finish = (char)local_70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_start._0_1_;
        local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
    }
    uVar15 = (long)local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start;
    pvVar7 = operator_new(40000);
    memset(pvVar7,0,40000);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_70,uVar15 & 0xffffffff,(allocator_type *)&local_58);
    local_9c = 0;
    bVar17 = (int)uVar15 != 0;
    local_a8 = pvVar7;
    local_48 = uVar15;
    if (bVar17) {
      uVar16 = uVar15 & 0xffffffff;
      uVar13 = 0;
      do {
        if (local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
            ._M_start[uVar13] != ']') {
          if (local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start[uVar13] == '[') {
            bVar18 = true;
            uVar10 = uVar13;
            if (uVar13 + 1 < uVar16) {
              iVar11 = 1;
              do {
                if (local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar10 + 1] == ']') {
                  iVar11 = iVar11 + -1;
                }
                else if (local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar10 + 1] == '[') {
                  iVar11 = iVar11 + 1;
                }
                uVar1 = uVar10 + 2;
                bVar18 = iVar11 != 0;
                uVar10 = uVar10 + 1;
              } while ((uVar1 < uVar16) && (iVar11 != 0));
            }
            if (bVar18) {
              local_9c = 1;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"Mismatching parens.",0x13);
              break;
            }
            *(int *)(CONCAT71(local_70.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start._1_7_,
                              local_70.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start._0_1_) + uVar13 * 4) =
                 (int)uVar10;
            *(int *)(CONCAT71(local_70.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start._1_7_,
                              local_70.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start._0_1_) +
                    (uVar10 & 0xffffffff) * 4) = (int)uVar13;
          }
          else {
            *(int *)(CONCAT71(local_70.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start._1_7_,
                              local_70.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start._0_1_) + uVar13 * 4) =
                 (int)uVar15;
          }
        }
        uVar13 = uVar13 + 1;
        bVar17 = uVar13 < uVar16;
      } while (uVar13 != uVar16);
    }
    if (!bVar17) {
      local_38 = (ulong)local_ac / 1000;
      local_40 = ((ulong)local_ac % 1000) * 1000000;
      iVar11 = 0;
      uVar3 = 0;
      local_b0 = 0;
      while (uVar3 < (uint)local_48) {
        if (0 < (int)local_ac) {
          local_58.tv_sec = local_38;
          local_58.tv_nsec = local_40;
          do {
            iVar4 = nanosleep(&local_58,&local_58);
            if (iVar4 != -1) break;
            piVar5 = __errno_location();
          } while (*piVar5 == 4);
        }
        lVar6 = (long)(int)uVar3;
        local_58.tv_sec =
             CONCAT71(local_58.tv_sec._1_7_,
                      local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar6]);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(char *)&local_58,1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,uVar3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar11);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
        lVar14 = (long)iVar11;
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,*(int *)((long)local_a8 + lVar14 * 4));
        std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
        uVar3 = uVar3 + 1;
        bVar2 = local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start[lVar6];
        if (bVar2 < 0x3c) {
          switch(bVar2) {
          case 0x2b:
            piVar5 = (int *)((long)local_a8 + lVar14 * 4);
            *piVar5 = *piVar5 + 1;
            break;
          case 0x2c:
            std::operator>>((istream *)&std::cin,&local_b1);
            *(int *)((long)local_a8 + lVar14 * 4) = (int)local_b1;
            break;
          case 0x2d:
            piVar5 = (int *)((long)local_a8 + lVar14 * 4);
            *piVar5 = *piVar5 + -1;
            break;
          case 0x2e:
            cVar12 = (char)*(undefined4 *)((long)local_a8 + lVar14 * 4);
            if (cVar12 < '\0') {
              cVar12 = '*';
            }
            local_58.tv_sec._0_1_ = cVar12;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,(char *)&local_58,1);
            std::ostream::flush();
            local_58.tv_sec = CONCAT71(local_58.tv_sec._1_7_,cVar12);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,(char *)&local_58,1);
          }
        }
        else if (bVar2 < 0x5b) {
          if (bVar2 == 0x3c) {
            bVar17 = iVar11 < 1;
            iVar11 = iVar11 + -1;
            if (bVar17) {
              iVar11 = 9999;
            }
          }
          else if ((bVar2 == 0x3e) && (bVar17 = 0x270e < iVar11, iVar11 = iVar11 + 1, bVar17)) {
            iVar11 = 0;
          }
        }
        else if (bVar2 == 0x5b) {
          if (*(int *)((long)local_a8 + lVar14 * 4) == 0) {
            iVar4 = *(int *)(CONCAT71(local_70.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                      local_70.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start._0_1_) + lVar6 * 4);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"- ",2);
            uVar3 = iVar4 + 1;
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"+ ",2);
            local_b0 = local_b0 + 1;
          }
          std::ostream::operator<<((ostream *)&std::cout,local_b0);
        }
        else if (bVar2 == 0x5d) {
          uVar3 = *(uint *)(CONCAT71(local_70.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                     local_70.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_start._0_1_) + lVar6 * 4);
          poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,uVar3);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
          local_b0 = local_b0 + -1;
          std::ostream::operator<<((ostream *)&std::cout,local_b0);
        }
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
        std::ostream::put(-0x50);
        std::ostream::flush();
      }
    }
    pvVar7 = local_a8;
    if ((void *)CONCAT71(local_70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start._1_7_,
                         local_70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start._0_1_) != (void *)0x0) {
      operator_delete((void *)CONCAT71(local_70.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                       local_70.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_start._0_1_));
    }
    operator_delete(pvVar7);
    iVar11 = local_9c;
    if (local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (char *)0x0) {
      operator_delete(local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    return iVar11;
  }
  std::__cxx11::string::string((string *)&local_98,argv[1],(allocator *)&local_70);
  __nptr = local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
           _M_start;
  piVar5 = __errno_location();
  iVar11 = *piVar5;
  *piVar5 = 0;
  lVar6 = strtol(__nptr,(char **)&local_70,10);
  if ((char *)CONCAT71(local_70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start._1_7_,
                       local_70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start._0_1_) == __nptr) {
    std::__throw_invalid_argument("stoi");
  }
  else {
    uVar3 = (uint)lVar6;
    if (((int)uVar3 == lVar6) && (*piVar5 != 0x22)) {
      if (*piVar5 == 0) {
        *piVar5 = iVar11;
      }
      local_ac = 0;
      if (0 < (int)uVar3) {
        local_ac = uVar3;
      }
      if ((pointer *)
          local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start !=
          &local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage) {
        operator_delete(local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      goto LAB_00102423;
    }
  }
  uVar9 = std::__throw_out_of_range("stoi");
  _Unwind_Resume(uVar9);
}

Assistant:

int main(int argc, char** argv) {
  cout.sync_with_stdio(false);

  int delay_ms = 0;
  if (argc > 1) {
    char* dn = argv[1];
    string st(dn);
    try {
      delay_ms = stoi(st);
    } catch (std::invalid_argument) {
      cerr << "Invalid duration." << endl;
      return 1;
    }
    if (delay_ms < 0) delay_ms = 0;
  }

  vector<char> code;
  {
    code.reserve(1024);
    char ch;
    while ((ch = getchar()) != END) {
      if (ch == BACK) {
        if (code.size()) code.pop_back();
      } else
        code.push_back(ch);
    }
  }
  const unsigned int m = code.size();

  vector<int> mem(N);
  int iMem = 0;

  vector<unsigned int> matching(m);
  for (unsigned int i = 0; i < m; i++) {
    switch (code[i]) {
      case '[':
        {
          unsigned int level = 1;
          unsigned int j = i + 1;
          for (; j < m && level > 0; j++) {
            switch (code[j]) {
              case '[': level++; break;
              case ']': level--; break;
              default: break;
            }
          }

          if (level > 0) {
            cerr << "Mismatching parens.";
            return 1;
          }

          j--;

          //cout << i << "::" << j << "- " << endl;
          matching[i] = j;
          matching[j] = i;
        }
        break;
      case ']':
        break;
      default:
        matching[i] = m;
        break;
    }
  }

#if 0
  for (int i = 0; i < m; i++) {
    cout << "[" << i << "] = " << code[i] << " ";
    if (matching[i] == m)
      cout << endl;
    else
      cout << matching[i] << endl;
  }
#endif

  int pc = 0;
  int level = 0;
  while (pc < m) {
    std::this_thread::sleep_for(std::chrono::milliseconds(delay_ms));
    int pc1 = pc + 1;
    cout << code[pc] << " " << pc << " " << iMem << " " << mem[iMem] << " ";
    switch (code[pc]) {
      case '+':
        mem[iMem]++;
        break;
      case '-':
        mem[iMem]--;
        break;
      case '<':
        iMem--;
        if (iMem < 0) iMem = N-1;
        break;
      case '>':
        iMem++;
        if (iMem >= N) iMem = 0;
        break;
      case '[':
        if (mem[iMem] == 0) {
          pc1 = matching[pc] + 1;
          cout << "- ";
        } else {
          cout << "+ ";
          level++;
        }
        cout << level;
        break;
      case ']':
        pc1 = matching[pc];
        cout << pc1 << " ";
        level--;
        cout << level;
        break;
      case '.':
        {
          char cho = !(((char)mem[iMem]) & (char)0x80) ? (char)mem[iMem] : '*';
          cerr << cho;
          cerr.flush();
          cout << cho;
        }
        break;
      case ',':
        char c; cin >> c;
        mem[iMem] = c;
        break;
      default: break;
    }
    cout << endl;
    pc = pc1;
  }
}